

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O0

map2json_t * map2json_init(char *prefix)

{
  map2json_t *str;
  csafestring_t *pcVar1;
  char *in_RDI;
  map2json_t *obj;
  
  str = (map2json_t *)malloc(0x20);
  pcVar1 = safe_create((char *)str);
  str->buffer = pcVar1;
  str->pairs = (map2json_keyvalue_t *)0x0;
  str->tree = (map2json_tree_t *)0x0;
  str->prefix = in_RDI;
  return str;
}

Assistant:

map2json_t *map2json_init(char *prefix) {
	DEBUG_TEXT("map2json_init(%s)... ", prefix);
	map2json_t *obj;

	obj = (map2json_t *) malloc(sizeof(map2json_t));
	obj->buffer = safe_create(NULL);
	obj->pairs = NULL;
	obj->tree = NULL;
	obj->prefix = prefix;

	DEBUG_TEXT("map2json_init(%s)... DONE", prefix);
	return obj;
}